

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

char * GetMonitorName(int monitor)

{
  GLFWmonitor **ppGVar1;
  char *pcVar2;
  int monitorCount;
  int local_c;
  
  local_c = 0;
  ppGVar1 = glfwGetMonitors(&local_c);
  if ((monitor < 0) || (local_c <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
    pcVar2 = "";
  }
  else {
    pcVar2 = glfwGetMonitorName(ppGVar1[(uint)monitor]);
  }
  return pcVar2;
}

Assistant:

const char *GetMonitorName(int monitor)
{
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount))
    {
        return glfwGetMonitorName(monitors[monitor]);
    }
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");
    return "";
}